

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall asl::PacketSocket_::readFrom(PacketSocket_ *this,InetAddress *a,void *data,int n)

{
  int __fd;
  void *__buf;
  size_t __n;
  sockaddr *__addr;
  ssize_t sVar1;
  socklen_t local_48;
  int r;
  socklen_t len;
  InetAddress local_38;
  int local_24;
  void *pvStack_20;
  int n_local;
  void *data_local;
  InetAddress *a_local;
  PacketSocket_ *this_local;
  
  local_24 = n;
  pvStack_20 = data;
  data_local = a;
  a_local = (InetAddress *)this;
  if (*(int *)&(this->super_Socket_).super_SmartObject_.field_0xc < 0) {
    Socket_::init(&this->super_Socket_,(EVP_PKEY_CTX *)0x0);
  }
  InetAddress::InetAddress(&local_38,(this->super_Socket_)._family);
  InetAddress::operator=((InetAddress *)data_local,&local_38);
  InetAddress::~InetAddress(&local_38);
  local_48 = InetAddress::length((InetAddress *)data_local);
  __buf = pvStack_20;
  __fd = *(int *)&(this->super_Socket_).super_SmartObject_.field_0xc;
  __n = (size_t)local_24;
  __addr = (sockaddr *)InetAddress::ptr((InetAddress *)data_local);
  sVar1 = recvfrom(__fd,__buf,__n,0,__addr,&local_48);
  return (int)sVar1;
}

Assistant:

int PacketSocket_::readFrom(InetAddress& a, void* data, int n)
{
	if (_handle < 0)
		init();
	a = InetAddress(_family);
	socklen_t len = (socklen_t)a.length();
	int r= recvfrom(_handle, (char*)data, n, 0, (sockaddr*)a.ptr(), &len);
	return r;
}